

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.hh
# Opt level: O2

void __thiscall Parsing::MalformedXML::MalformedXML(MalformedXML *this,string *file)

{
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"malformed XML",&local_39);
  Typelib::ImportError::ImportError(&this->super_ImportError,(string *)file,local_38,0,0);
  std::__cxx11::string::~string(local_38);
  *(undefined ***)this = &PTR__ImportError_00113840;
  return;
}

Assistant:

MalformedXML(const std::string& file = "")
            : ImportError(file, "malformed XML") {}